

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void send_file_data(mg_connection *conn,mg_file *filep,int64_t offset,int64_t len,int no_buffering)

{
  byte bVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  __int32_t **pp_Var6;
  ssize_t sVar7;
  int *piVar8;
  char *pcVar9;
  long lVar10;
  char *func;
  ulong __off;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  char buf [8192];
  ulong local_2038 [1025];
  
  if (conn != (mg_connection *)0x0 && filep != (mg_file *)0x0) {
    uVar5 = (filep->stat).size;
    if ((ulong)offset <= uVar5) {
      uVar5 = offset;
    }
    uVar12 = 0xffffffff;
    if (0x7ffffffffffffffe < uVar5) {
      uVar5 = 0x7fffffffffffffff;
    }
    __off = 0;
    if (-1 < offset) {
      __off = uVar5;
    }
    if ((0 < len) && (__stream = (FILE *)(filep->access).fp, __stream != (FILE *)0x0)) {
      if ((conn->ssl == (SSL *)0x0) && (conn->throttle == 0)) {
        pcVar9 = conn->dom_ctx->config[8];
        pp_Var6 = __ctype_tolower_loc();
        lVar10 = 0;
        do {
          bVar1 = pcVar9[lVar10];
          iVar3 = (*pp_Var6)[bVar1];
          iVar11 = (*pp_Var6)[(byte)"yes"[lVar10]];
          if (bVar1 == 0) break;
          lVar10 = lVar10 + 1;
        } while (iVar3 == iVar11);
        uVar12 = (uint)lVar10;
        if (iVar3 == iVar11) {
          local_2038[0] = __off;
          iVar3 = fileno(__stream);
          iVar11 = 0;
          while( true ) {
            sVar13 = 0x7ffff000;
            if (len < 0x7ffff000) {
              sVar13 = len;
            }
            sVar7 = sendfile64((conn->client).sock,iVar3,(__off64_t *)local_2038,sVar13);
            uVar12 = (uint)sVar13;
            if (sVar7 < 1) break;
            iVar11 = iVar11 + -1;
            sVar13 = len - sVar7;
            bVar2 = len < sVar7;
            len = sVar13;
            if (sVar13 == 0 || bVar2) {
              return;
            }
          }
          __off = local_2038[0];
          if ((iVar11 != 0) && (sVar7 == 0)) {
            return;
          }
        }
      }
      if (((long)__off < 1) || (iVar3 = fseeko64((FILE *)(filep->access).fp,__off,0), iVar3 == 0)) {
        if (0 < len) {
          do {
            sVar13 = len & 0xffffffff;
            if (0x1fff < (ulong)len) {
              sVar13 = 0x2000;
            }
            sVar13 = fread(local_2038,1,sVar13,(FILE *)(filep->access).fp);
            uVar12 = (uint)sVar13;
          } while (((0 < (int)uVar12) &&
                   (uVar4 = mg_write(conn,local_2038,(ulong)(uVar12 & 0x7fffffff)), uVar4 == uVar12)
                   ) && (uVar5 = len - (ulong)(uVar12 & 0x7fffffff),
                        bVar2 = (long)(ulong)(uVar12 & 0x7fffffff) <= len, len = uVar5,
                        uVar5 != 0 && bVar2));
        }
      }
      else {
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        mg_cry_internal_wrap
                  (conn,(mg_context *)0x0,func,uVar12,"%s: fseeko() failed: %s","send_file_data",
                   pcVar9);
        mg_send_http_error(conn,500,"%s","Error: Unable to access file at requested position.");
      }
    }
  }
  return;
}

Assistant:

static void
send_file_data(struct mg_connection *conn,
               struct mg_file *filep,
               int64_t offset,
               int64_t len,
               int no_buffering)
{
	char buf[MG_BUF_LEN];
	int to_read, num_read, num_written;
	int64_t size;

	if (!filep || !conn) {
		return;
	}

	/* Sanity check the offset */
	size = (filep->stat.size > INT64_MAX) ? INT64_MAX
	                                      : (int64_t)(filep->stat.size);
	offset = (offset < 0) ? 0 : ((offset > size) ? size : offset);

	if (len > 0 && filep->access.fp != NULL) {
		/* file stored on disk */
#if defined(__linux__)
		/* sendfile is only available for Linux */
		if ((conn->ssl == 0) && (conn->throttle == 0)
		    && (!mg_strcasecmp(conn->dom_ctx->config[ALLOW_SENDFILE_CALL],
		                       "yes"))) {
			off_t sf_offs = (off_t)offset;
			ssize_t sf_sent;
			int sf_file = fileno(filep->access.fp);
			int loop_cnt = 0;

			do {
				/* 2147479552 (0x7FFFF000) is a limit found by experiment on
				 * 64 bit Linux (2^31 minus one memory page of 4k?). */
				size_t sf_tosend =
				    (size_t)((len < 0x7FFFF000) ? len : 0x7FFFF000);
				sf_sent =
				    sendfile(conn->client.sock, sf_file, &sf_offs, sf_tosend);
				if (sf_sent > 0) {
					len -= sf_sent;
					offset += sf_sent;
				} else if (loop_cnt == 0) {
					/* This file can not be sent using sendfile.
					 * This might be the case for pseudo-files in the
					 * /sys/ and /proc/ file system.
					 * Use the regular user mode copy code instead. */
					break;
				} else if (sf_sent == 0) {
					/* No error, but 0 bytes sent. May be EOF? */
					return;
				}
				loop_cnt++;

			} while ((len > 0) && (sf_sent >= 0));

			if (sf_sent > 0) {
				return; /* OK */
			}

			/* sf_sent<0 means error, thus fall back to the classic way */
			/* This is always the case, if sf_file is not a "normal" file,
			 * e.g., for sending data from the output of a CGI process. */
			offset = (int64_t)sf_offs;
		}
#endif
		if ((offset > 0) && (fseeko(filep->access.fp, offset, SEEK_SET) != 0)) {
			mg_cry_internal(conn,
			                "%s: fseeko() failed: %s",
			                __func__,
			                strerror(ERRNO));
			mg_send_http_error(
			    conn,
			    500,
			    "%s",
			    "Error: Unable to access file at requested position.");
		} else {
			while (len > 0) {
				/* Calculate how much to read from the file into the buffer. */
				/* If no_buffering is set, we should not wait until the
				 * CGI->Server buffer is filled, but send everything
				 * immediately. In theory buffering could be turned off using
				 * setbuf(filep->access.fp, NULL);
				 * setvbuf(filep->access.fp, NULL, _IONBF, 0);
				 * but in practice this does not work. A "Linux only" solution
				 * may be to use select(). The only portable way is to read byte
				 * by byte, but this is quite inefficient from a performance
				 * point of view. */
				to_read = no_buffering ? 1 : sizeof(buf);
				if ((int64_t)to_read > len) {
					to_read = (int)len;
				}

				/* Read from file, exit the loop on error */
				if ((num_read =
				         (int)fread(buf, 1, (size_t)to_read, filep->access.fp))
				    <= 0) {
					break;
				}

				/* Send read bytes to the client, exit the loop on error */
				if ((num_written = mg_write(conn, buf, (size_t)num_read))
				    != num_read) {
					break;
				}

				/* Both read and were successful, adjust counters */
				len -= num_written;
			}
		}
	}
}